

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linker.c
# Opt level: O0

void print_function_name(Section *sec,unsigned_long offs)

{
  FILE *__stream;
  char *pcVar1;
  ulong in_RSI;
  Section *in_RDI;
  int i;
  Symbol *func;
  Symbol *sym;
  undefined4 in_stack_ffffffffffffffd8;
  int iVar2;
  Symbol *local_20;
  Symbol *local_18;
  
  __stream = _stderr;
  local_20 = (Symbol *)0x0;
  iVar2 = 0;
  do {
    if (0x1f < iVar2) {
      if ((local_20 != (Symbol *)0x0) && (local_20 != print_function_name::last_func)) {
        print_function_name::last_func = local_20;
        pcVar1 = getobjname((ObjectUnit *)CONCAT44(iVar2,in_stack_ffffffffffffffd8));
        fprintf(__stream,"%s: In %s\"%s\":\n",pcVar1,print_function_name::infoname[local_20->info],
                local_20->name);
      }
      return;
    }
    for (local_18 = in_RDI->obj->objsyms[iVar2]; local_18 != (Symbol *)0x0;
        local_18 = local_18->obj_chain) {
      if ((((local_18->relsect == in_RDI) && (local_18->info < 3)) && (local_18->type == '\x02')) &&
         ((ulong)local_18->value <= in_RSI)) {
        if (local_18->size == 0) {
          if (local_20 == (Symbol *)0x0) {
            local_20 = local_18;
          }
          else if ((local_20->value < local_18->value) &&
                  ((local_20->bind < 2 || (1 < local_18->bind)))) {
            local_20 = local_18;
          }
        }
        else if (in_RSI < local_18->value + (ulong)local_18->size) {
          local_20 = local_18;
          iVar2 = 0x20;
          break;
        }
      }
    }
    iVar2 = iVar2 + 1;
  } while( true );
}

Assistant:

void print_function_name(struct Section *sec,unsigned long offs)
/* Try to determine the function to which the section offset */
/* belongs, by comparing with SYMI_FUNC-type symbol definitions. */
/* If this was successful and the current function is different */
/* from the last one printed, make an output to stderr. */
{
  static const char *infoname[] = { "", "object ", "function " };
  static struct Symbol *last_func=NULL;
  struct Symbol *sym,*func=NULL;
  int i;

  for (i=0; i<OBJSYMHTABSIZE; i++) {  /* scan all hash chains */
    for (sym=sec->obj->objsyms[i]; sym; sym=sym->obj_chain) {
      if (sym->relsect == sec) {
        if (sym->info <= SYMI_FUNC) {
          if (sym->type == SYM_RELOC) {
            if ((unsigned long)sym->value <= offs) {
              if (sym->size) {  /* size of function specified? */
                if ((unsigned long)(sym->value+sym->size) > offs) {
                  func = sym;
                  i = OBJSYMHTABSIZE;
                  break;  /* function found! */
                }
              }
              else {  /* no size - find nearest... */
                if (func) {
                  if (sym->value > func->value) {
                    if (func->bind<SYMB_GLOBAL || sym->bind>=SYMB_GLOBAL)
                      func = sym;
                  }
                }
                else
                  func = sym;
              }
            }
          }
        }
      }
    }
  }

  /* print function name */
  if (func && func!=last_func) {
    last_func = func;
    fprintf(stderr,"%s: In %s\"%s\":\n",getobjname(sec->obj),
            infoname[func->info],func->name);
  }
}